

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O2

int mbedtls_chachapoly_update(mbedtls_chachapoly_context *ctx,size_t len,uchar *input,uchar *output)

{
  int iVar1;
  
  if (ctx->state - 1U < 2) {
    if (ctx->state == 1) {
      ctx->state = 2;
      iVar1 = chachapoly_pad_aad(ctx);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    ctx->ciphertext_len = ctx->ciphertext_len + len;
    if (ctx->mode == MBEDTLS_CHACHAPOLY_ENCRYPT) {
      iVar1 = mbedtls_chacha20_update(&ctx->chacha20_ctx,len,input,output);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_poly1305_update(&ctx->poly1305_ctx,output,len);
    }
    else {
      iVar1 = mbedtls_poly1305_update(&ctx->poly1305_ctx,input,len);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_chacha20_update(&ctx->chacha20_ctx,len,input,output);
    }
    if (iVar1 == 0) {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = -0x54;
  }
  return iVar1;
}

Assistant:

int mbedtls_chachapoly_update( mbedtls_chachapoly_context *ctx,
                               size_t len,
                               const unsigned char *input,
                               unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    CHACHAPOLY_VALIDATE_RET( ctx != NULL );
    CHACHAPOLY_VALIDATE_RET( len == 0 || input != NULL );
    CHACHAPOLY_VALIDATE_RET( len == 0 || output != NULL );

    if( ( ctx->state != CHACHAPOLY_STATE_AAD ) &&
        ( ctx->state != CHACHAPOLY_STATE_CIPHERTEXT ) )
    {
        return( MBEDTLS_ERR_CHACHAPOLY_BAD_STATE );
    }

    if( ctx->state == CHACHAPOLY_STATE_AAD )
    {
        ctx->state = CHACHAPOLY_STATE_CIPHERTEXT;

        ret = chachapoly_pad_aad( ctx );
        if( ret != 0 )
            return( ret );
    }

    ctx->ciphertext_len += len;

    if( ctx->mode == MBEDTLS_CHACHAPOLY_ENCRYPT )
    {
        ret = mbedtls_chacha20_update( &ctx->chacha20_ctx, len, input, output );
        if( ret != 0 )
            return( ret );

        ret = mbedtls_poly1305_update( &ctx->poly1305_ctx, output, len );
        if( ret != 0 )
            return( ret );
    }
    else /* DECRYPT */
    {
        ret = mbedtls_poly1305_update( &ctx->poly1305_ctx, input, len );
        if( ret != 0 )
            return( ret );

        ret = mbedtls_chacha20_update( &ctx->chacha20_ctx, len, input, output );
        if( ret != 0 )
            return( ret );
    }

    return( 0 );
}